

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,TPZCompMesh *mesh,TPZGeoEl *gel)

{
  TPZGeoEl *this_00;
  TPZCompEl *in_RDI;
  HDivFamily in_stack_00000154;
  TPZGeoEl *in_stack_00000158;
  TPZCompMesh *in_stack_00000160;
  void **in_stack_00000168;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *in_stack_00000170;
  pointer_____offset_0x60___ *this_01;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  this_01 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024d4cf0);
  TPZCompElHDiv<pzshape::TPZShapeLinear>::TPZCompElHDiv
            (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
             in_stack_00000154);
  *(undefined ***)in_RDI = &PTR__TPZCompElHDivCollapsed_024d48c0;
  *(undefined ***)in_RDI = &PTR__TPZCompElHDivCollapsed_024d48c0;
  *(undefined8 *)(in_RDI + 5) = 0xffffffffffffffff;
  in_RDI[5].fMesh = (TPZCompMesh *)0xffffffffffffffff;
  *(undefined4 *)&in_RDI[5].fIndex = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[5].fIndex + 4) = 1;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this_01);
  TPZGeoEl::SetReference(this_00,in_RDI);
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,gel)
{
//    fbottom_c_index = -1; set at constructor in .h
//    ftop_c_index = -1; set at constructor in .h
//    fbottom_side_orient = -1; in .h
//    ftop_side_orient = 1; in .h
    this->Reference()->SetReference(this);
    

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	 {
         std::stringstream sout;
         sout << "Finalizando criacao do elemento ";
         this->Print(sout);
         LOGPZ_DEBUG(logger,sout.str())
	 }
#endif
	 
}